

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::dump
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this,
          basic_ostream<char,_std::char_traits<char>_> *os,basic_json_encode_options<char> *options,
          indenting indent)

{
  ser_error *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  dump(this,os,options,indent,&ec);
  if (ec._M_value == 0) {
    return;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this_00,ec_00);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void dump(std::basic_ostream<char_type>& os, 
            const basic_json_encode_options<char_type>& options = basic_json_options<CharT>(),
            indenting indent = indenting::no_indent) const
        {
            std::error_code ec;
            dump(os, options, indent, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec));
            }
        }